

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNewLineStyle.cxx
# Opt level: O3

bool __thiscall
cmNewLineStyle::ReadFromArguments
          (cmNewLineStyle *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errorString)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong unaff_RBX;
  ulong uVar4;
  Style SVar5;
  long lVar6;
  pointer pbVar7;
  byte bVar8;
  bool bVar9;
  string eol;
  long *local_50 [2];
  long local_40 [2];
  
  this->NewLineStyle = Invalid;
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar8 = 1;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
    lVar6 = 0;
    uVar4 = 1;
    do {
      iVar2 = std::__cxx11::string::compare((char *)((long)&(pbVar7->_M_dataplus)._M_p + lVar6));
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5;
      if (iVar2 == 0) {
        if (uVar4 < uVar3) {
          lVar1 = *(long *)((long)&pbVar7[1]._M_dataplus._M_p + lVar6);
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_50,lVar1,
                     *(long *)((long)&pbVar7[1]._M_string_length + lVar6) + lVar1);
          iVar2 = std::__cxx11::string::compare((char *)local_50);
          SVar5 = LF;
          if (iVar2 == 0) {
LAB_00275fc0:
            this->NewLineStyle = SVar5;
            unaff_RBX = 1;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)local_50);
            if (iVar2 == 0) goto LAB_00275fc0;
            iVar2 = std::__cxx11::string::compare((char *)local_50);
            SVar5 = CRLF;
            if (iVar2 == 0) goto LAB_00275fc0;
            iVar2 = std::__cxx11::string::compare((char *)local_50);
            if (iVar2 == 0) goto LAB_00275fc0;
            iVar2 = std::__cxx11::string::compare((char *)local_50);
            if (iVar2 == 0) goto LAB_00275fc0;
            std::__cxx11::string::operator=
                      ((string *)errorString,
                       "NEWLINE_STYLE sets an unknown style, only LF, CRLF, UNIX, DOS, and WIN32 are supported"
                      );
            unaff_RBX = 0;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          bVar8 = 0;
        }
        else {
          bVar8 = 0;
          std::__cxx11::string::_M_replace
                    ((ulong)errorString,0,(char *)errorString->_M_string_length,0x4adc2d);
          unaff_RBX = 0;
        }
        break;
      }
      lVar6 = lVar6 + 0x20;
      unaff_RBX = uVar4 + 1;
      bVar9 = uVar4 < uVar3;
      uVar4 = unaff_RBX;
    } while (bVar9);
  }
  return (bool)(bVar8 | (byte)unaff_RBX & 1);
}

Assistant:

bool cmNewLineStyle::ReadFromArguments(const std::vector<std::string>& args,
                                       std::string& errorString)
{
  NewLineStyle = Invalid;

  for (size_t i = 0; i< args.size(); i++)
    {
    if (args[i] == "NEWLINE_STYLE")
      {
      size_t const styleIndex = i + 1;
      if (args.size() > styleIndex)
        {
        const std::string eol = args[styleIndex];
        if (eol == "LF" || eol == "UNIX")
          {
          NewLineStyle = LF;
          return true;
          }
        else if (eol == "CRLF" || eol == "WIN32" || eol == "DOS")
          {
          NewLineStyle = CRLF;
          return true;
          }
        else
          {
          errorString = "NEWLINE_STYLE sets an unknown style, only LF, "
                        "CRLF, UNIX, DOS, and WIN32 are supported";
          return false;
          }
        }
      else
        {
        errorString = "NEWLINE_STYLE must set a style: "
                      "LF, CRLF, UNIX, DOS, or WIN32";
        return false;
        }
      }
    }
  return true;
}